

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter> *this)

{
  int iVar1;
  char *pcVar2;
  TextReader<fmt::Locale> *this_00;
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar1 = 0;
  if (0 < **(int **)(this + 8)) {
    iVar1 = **(int **)(this + 8);
  }
  do {
    if (iVar1 == 0) {
      return;
    }
    this_00 = *(TextReader<fmt::Locale> **)this;
    pcVar2 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar2;
    (this_00->super_ReaderBase).ptr_ = pcVar2 + 1;
    switch(*pcVar2) {
    case '0':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      this_00 = *(TextReader<fmt::Locale> **)this;
    case '1':
    case '2':
    case '4':
      TextReader<fmt::Locale>::ReadDouble(this_00);
      break;
    case '3':
      break;
    case '5':
      pcVar2 = "COMPL bound type is invalid for variables";
      goto LAB_00105d44;
    default:
      pcVar2 = "expected bound";
LAB_00105d44:
      TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)pcVar2);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
    iVar1 = iVar1 + -1;
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}